

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O2

void cfl_load_dc_pred(MACROBLOCKD *xd,uint8_t *dst,int dst_stride,TX_SIZE tx_size,
                     CFL_PRED_TYPE pred_plane)

{
  int iVar1;
  int iVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  void *__dest;
  int iVar4;
  bool bVar5;
  
  uVar3 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_size) << 2);
  iVar1 = *(int *)((long)tx_size_wide + uVar3);
  iVar2 = *(int *)((long)tx_size_high + uVar3);
  if ((xd->cur_buf->flags & 8) == 0) {
    iVar4 = 0;
    if (0 < iVar2) {
      iVar4 = iVar2;
    }
    while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
      memcpy(dst,(xd->cfl).dc_pred_cache + pred_plane,(long)iVar1);
      dst = dst + dst_stride;
    }
  }
  else {
    __dest = (void *)((long)dst * 2);
    iVar4 = 0;
    if (0 < iVar2) {
      iVar4 = iVar2;
    }
    while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
      memcpy(__dest,(xd->cfl).dc_pred_cache + pred_plane,(long)(iVar1 * 2));
      __dest = (void *)((long)__dest + (long)dst_stride * 2);
    }
  }
  return;
}

Assistant:

void cfl_load_dc_pred(MACROBLOCKD *const xd, uint8_t *dst, int dst_stride,
                      TX_SIZE tx_size, CFL_PRED_TYPE pred_plane) {
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  assert(pred_plane < CFL_PRED_PLANES);
  assert(width <= CFL_BUF_LINE);
  assert(height <= CFL_BUF_LINE);
  if (is_cur_buf_hbd(xd)) {
    uint16_t *dst_16 = CONVERT_TO_SHORTPTR(dst);
    cfl_load_dc_pred_hbd(xd->cfl.dc_pred_cache[pred_plane], dst_16, dst_stride,
                         width, height);
    return;
  }
  cfl_load_dc_pred_lbd(xd->cfl.dc_pred_cache[pred_plane], dst, dst_stride,
                       width, height);
}